

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O3

_Bool duckdb_je_ckh_remove(tsd_t *tsd,ckh_t *ckh,void *searchkey,void **key,void **data)

{
  long *plVar1;
  rtree_ctx_t *rtree_ctx;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  uintptr_t uVar5;
  void *pvVar6;
  ckhc_t *aTab;
  arena_t *paVar7;
  long lVar8;
  uintptr_t uVar9;
  undefined8 uVar10;
  _Bool _Var11;
  uint uVar12;
  size_t sVar13;
  ulong uVar14;
  ckhc_t *pcVar15;
  rtree_leaf_elm_t *prVar16;
  atomic_p_t arena;
  long lVar17;
  byte bVar18;
  uintptr_t uVar19;
  ulong uVar20;
  size_t usize;
  uintptr_t *puVar21;
  
  sVar13 = ckh_isearch(ckh,searchkey);
  if (sVar13 == 0xffffffffffffffff) goto LAB_00cef5a1;
  if (key != (void **)0x0) {
    *key = ckh->tab[sVar13].key;
  }
  if (data != (void **)0x0) {
    *data = ckh->tab[sVar13].data;
  }
  pcVar15 = ckh->tab;
  pcVar15[sVar13].key = (void *)0x0;
  pcVar15[sVar13].data = (void *)0x0;
  uVar14 = ckh->count - 1;
  ckh->count = uVar14;
  uVar4 = ckh->lg_curbuckets;
  if ((uVar14 >> ((byte)uVar4 & 0x3f) != 0) || (uVar4 <= ckh->lg_minbuckets)) goto LAB_00cef5a1;
  bVar18 = (byte)uVar4 + 1;
  uVar14 = 0x10L << (bVar18 & 0x3f);
  if (uVar14 < 0x3801) {
    uVar12 = (int)uVar14 + 0x3fU & 0x7fc0;
    if (uVar12 < 0x1001) {
      usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar12 >> 3]];
    }
    else {
      uVar14 = (ulong)uVar12 * 2 - 1;
      lVar17 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      uVar14 = -1L << (0x3c - ((byte)lVar17 ^ 0x3f) & 0x3f);
      usize = ~uVar14 + (ulong)uVar12 & uVar14;
    }
    uVar20 = 0x4000;
    if (0x3fff < usize) goto LAB_00cef315;
  }
  else {
    uVar20 = 0x4000;
    if (0x4000 < uVar14) {
      if (uVar14 < 0x7000000000000001) {
        uVar20 = (0x20L << (bVar18 & 0x3f)) - 1;
        lVar17 = 0x3f;
        if (uVar20 != 0) {
          for (; uVar20 >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        uVar20 = -1L << (0x3c - ((byte)lVar17 ^ 0x3f) & 0x3f);
        uVar20 = ~uVar20 + uVar14 & uVar20;
      }
      else {
        uVar20 = 0;
      }
      if (uVar20 < uVar14) goto LAB_00cef5a1;
    }
LAB_00cef315:
    usize = 0;
    if (!CARRY8(duckdb_je_sz_large_pad,uVar20)) {
      usize = uVar20;
    }
  }
  if (0x8fffffffffffffff < usize + 0x8fffffffffffffff) {
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
      arena.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena;
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == (arena_t *)0x0) &&
         (arena.repr = duckdb_je_arena_choose_hard(tsd,true),
         tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)) {
        paVar7 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena;
        if (paVar7 == (arena_t *)0x0) {
          duckdb_je_tcache_arena_associate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                     (arena_t *)arena.repr);
        }
        else if (paVar7 != (arena_t *)arena.repr) {
          duckdb_je_tcache_arena_reassociate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                     (arena_t *)arena.repr);
        }
      }
    }
    else {
      arena = duckdb_je_arenas[0];
      if (duckdb_je_arenas[0].repr == (void *)0x0) {
        arena.repr = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
      }
    }
    pcVar15 = (ckhc_t *)
              duckdb_je_arena_palloc
                        ((tsdn_t *)tsd,(arena_t *)arena.repr,usize,0x40,true,usize < 0x3801,
                         (tcache_t *)0x0);
    if (pcVar15 != (ckhc_t *)0x0) {
      rtree_ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      uVar14 = (ulong)pcVar15 & 0xffffffffc0000000;
      uVar12 = ((uint)((ulong)pcVar15 >> 0x1e) & 0xf) << 4;
      puVar21 = (uintptr_t *)
                ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                        [0].leafkey + (ulong)uVar12);
      uVar5 = *puVar21;
      uVar19 = uVar14;
      if (uVar5 == uVar14) {
        prVar16 = (rtree_leaf_elm_t *)
                  ((ulong)((uint)((ulong)pcVar15 >> 9) & 0x1ffff8) +
                  *(long *)((long)&(tsd->
                                   cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                   cache[0].leaf + (ulong)uVar12));
      }
      else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
               leafkey == uVar14) {
        prVar16 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0]
                  .leaf;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
             uVar5;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
             *(rtree_leaf_elm_t **)
              ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                      [0].leaf + (ulong)uVar12);
        *puVar21 = uVar14;
        *(rtree_leaf_elm_t **)
         ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].
                 leaf + (ulong)uVar12) = prVar16;
        prVar16 = (rtree_leaf_elm_t *)
                  ((long)&(prVar16->le_bits).repr + (ulong)((uint)((ulong)pcVar15 >> 9) & 0x1ffff8))
        ;
      }
      else {
        lVar17 = 0x2d0;
        do {
          if (*(ulong *)((long)tsd + lVar17 + -8) == uVar14) {
            lVar8 = *(long *)(&tsd->
                               cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                             + lVar17);
            puVar2 = (undefined8 *)((long)tsd + lVar17 + -0x18);
            uVar10 = puVar2[1];
            puVar3 = (undefined8 *)((long)tsd + lVar17 + -8);
            *puVar3 = *puVar2;
            puVar3[1] = uVar10;
            *(uintptr_t *)((long)tsd + lVar17 + -0x18) = uVar5;
            *(undefined8 *)((long)tsd + lVar17 + -0x10) =
                 *(undefined8 *)
                  ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                          cache[0].leaf + (ulong)uVar12);
            *puVar21 = uVar14;
            *(long *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                             cache[0].leaf + (ulong)uVar12) = lVar8;
            prVar16 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)pcVar15 >> 9) & 0x1ffff8) + lVar8);
            goto LAB_00cef3e1;
          }
          lVar17 = lVar17 + 0x10;
        } while (lVar17 != 0x340);
        prVar16 = duckdb_je_rtree_leaf_elm_lookup_hard
                            ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                             (uintptr_t)pcVar15,true,false);
        uVar19 = *puVar21;
      }
LAB_00cef3e1:
      pvVar6 = duckdb_je_arenas
               [*(uint *)(((long)(prVar16->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
                0xfff].repr;
      if (uVar19 == uVar14) {
        prVar16 = (rtree_leaf_elm_t *)
                  ((ulong)((uint)((ulong)pcVar15 >> 9) & 0x1ffff8) +
                  *(long *)((long)&(tsd->
                                   cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                                   cache[0].leaf + (ulong)uVar12));
      }
      else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
               leafkey == uVar14) {
        prVar16 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0]
                  .leaf;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
             uVar19;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
             *(rtree_leaf_elm_t **)
              ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                      [0].leaf + (ulong)uVar12);
LAB_00cef6ba:
        *puVar21 = uVar14;
        *(rtree_leaf_elm_t **)
         ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].
                 leaf + (ulong)uVar12) = prVar16;
        prVar16 = (rtree_leaf_elm_t *)
                  ((long)&(prVar16->le_bits).repr + (ulong)((uint)((ulong)pcVar15 >> 9) & 0x1ffff8))
        ;
      }
      else {
        lVar17 = 0x2d0;
        do {
          if (*(ulong *)((long)tsd + lVar17 + -8) == uVar14) {
            prVar16 = *(rtree_leaf_elm_t **)
                       (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                       lVar17);
            puVar2 = (undefined8 *)((long)tsd + lVar17 + -0x18);
            uVar10 = puVar2[1];
            puVar3 = (undefined8 *)((long)tsd + lVar17 + -8);
            *puVar3 = *puVar2;
            puVar3[1] = uVar10;
            *(uintptr_t *)((long)tsd + lVar17 + -0x18) = uVar19;
            *(undefined8 *)((long)tsd + lVar17 + -0x10) =
                 *(undefined8 *)
                  ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                          cache[0].leaf + (ulong)uVar12);
            goto LAB_00cef6ba;
          }
          lVar17 = lVar17 + 0x10;
        } while (lVar17 != 0x340);
        prVar16 = duckdb_je_rtree_leaf_elm_lookup_hard
                            ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                             (uintptr_t)pcVar15,true,false);
      }
      LOCK();
      plVar1 = (long *)((long)pvVar6 + 0x48);
      *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[(ulong)(prVar16->le_bits).repr >> 0x30];
      UNLOCK();
      aTab = ckh->tab;
      ckh->tab = pcVar15;
      ckh->lg_curbuckets = uVar4 - 1;
      _Var11 = ckh_rebuild(ckh,aTab);
      if (_Var11) {
        pcVar15 = ckh->tab;
        uVar20 = (ulong)pcVar15 & 0xffffffffc0000000;
        uVar14 = (ulong)(((uint)((ulong)pcVar15 >> 0x1e) & 0xf) << 4);
        puVar21 = (uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + uVar14);
        uVar5 = *(uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + uVar14);
        uVar19 = uVar20;
        if (uVar5 == uVar20) {
          prVar16 = (rtree_leaf_elm_t *)
                    ((ulong)((uint)((ulong)pcVar15 >> 9) & 0x1ffff8) + puVar21[1]);
        }
        else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
                 leafkey == uVar20) {
          prVar16 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache
                    [0].leaf;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey
               = uVar5;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
               (rtree_leaf_elm_t *)puVar21[1];
          *puVar21 = uVar20;
          puVar21[1] = (uintptr_t)prVar16;
          prVar16 = (rtree_leaf_elm_t *)
                    ((long)&(prVar16->le_bits).repr +
                    (ulong)((uint)((ulong)pcVar15 >> 9) & 0x1ffff8));
        }
        else {
          lVar17 = 0x2d0;
          do {
            if (*(ulong *)((long)tsd + lVar17 + -8) == uVar20) {
              uVar9 = *(uintptr_t *)
                       (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                       lVar17);
              puVar2 = (undefined8 *)((long)tsd + lVar17 + -0x18);
              uVar10 = puVar2[1];
              puVar3 = (undefined8 *)((long)tsd + lVar17 + -8);
              *puVar3 = *puVar2;
              puVar3[1] = uVar10;
              *(uintptr_t *)((long)tsd + lVar17 + -0x18) = uVar5;
              *(uintptr_t *)((long)tsd + lVar17 + -0x10) = puVar21[1];
              *puVar21 = uVar20;
              puVar21[1] = uVar9;
              prVar16 = (rtree_leaf_elm_t *)(((uint)((ulong)pcVar15 >> 9) & 0x1ffff8) + uVar9);
              goto LAB_00cef49a;
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar17 != 0x340);
          prVar16 = duckdb_je_rtree_leaf_elm_lookup_hard
                              ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                               (uintptr_t)pcVar15,true,false);
          uVar19 = *puVar21;
        }
LAB_00cef49a:
        pvVar6 = duckdb_je_arenas
                 [*(uint *)(((long)(prVar16->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
                  0xfff].repr;
        if (uVar19 == uVar20) {
          prVar16 = (rtree_leaf_elm_t *)
                    ((ulong)((uint)((ulong)pcVar15 >> 9) & 0x1ffff8) + puVar21[1]);
        }
        else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
                 leafkey == uVar20) {
          prVar16 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache
                    [0].leaf;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey
               = uVar19;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
               (rtree_leaf_elm_t *)puVar21[1];
LAB_00cef793:
          *puVar21 = uVar20;
          puVar21[1] = (uintptr_t)prVar16;
          prVar16 = (rtree_leaf_elm_t *)
                    ((long)&(prVar16->le_bits).repr +
                    (ulong)((uint)((ulong)pcVar15 >> 9) & 0x1ffff8));
        }
        else {
          lVar17 = 0x2d0;
          do {
            if (*(ulong *)((long)tsd + lVar17 + -8) == uVar20) {
              prVar16 = *(rtree_leaf_elm_t **)
                         (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                         + lVar17);
              puVar2 = (undefined8 *)((long)tsd + lVar17 + -0x18);
              uVar10 = puVar2[1];
              puVar3 = (undefined8 *)((long)tsd + lVar17 + -8);
              *puVar3 = *puVar2;
              puVar3[1] = uVar10;
              *(uintptr_t *)((long)tsd + lVar17 + -0x18) = uVar19;
              *(uintptr_t *)((long)tsd + lVar17 + -0x10) = puVar21[1];
              goto LAB_00cef793;
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar17 != 0x340);
          prVar16 = duckdb_je_rtree_leaf_elm_lookup_hard
                              ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                               (uintptr_t)pcVar15,true,false);
        }
        LOCK();
        plVar1 = (long *)((long)pvVar6 + 0x48);
        *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[(ulong)(prVar16->le_bits).repr >> 0x30];
        UNLOCK();
        arena_dalloc_no_tcache((tsdn_t *)tsd,pcVar15);
        ckh->tab = aTab;
        ckh->lg_curbuckets = uVar4;
      }
      else {
        uVar20 = (ulong)aTab & 0xffffffffc0000000;
        uVar14 = (ulong)(((uint)((ulong)aTab >> 0x1e) & 0xf) << 4);
        puVar21 = (uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + uVar14);
        uVar5 = *(uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + uVar14);
        uVar19 = uVar20;
        if (uVar5 == uVar20) {
          prVar16 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8) + puVar21[1]);
        }
        else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
                 leafkey == uVar20) {
          prVar16 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache
                    [0].leaf;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey
               = uVar5;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
               (rtree_leaf_elm_t *)puVar21[1];
          *puVar21 = uVar20;
          puVar21[1] = (uintptr_t)prVar16;
          prVar16 = (rtree_leaf_elm_t *)
                    ((long)&(prVar16->le_bits).repr + (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
        }
        else {
          lVar17 = 0x2d0;
          do {
            if (*(ulong *)((long)tsd + lVar17 + -8) == uVar20) {
              uVar9 = *(uintptr_t *)
                       (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled +
                       lVar17);
              puVar2 = (undefined8 *)((long)tsd + lVar17 + -0x18);
              uVar10 = puVar2[1];
              puVar3 = (undefined8 *)((long)tsd + lVar17 + -8);
              *puVar3 = *puVar2;
              puVar3[1] = uVar10;
              *(uintptr_t *)((long)tsd + lVar17 + -0x18) = uVar5;
              *(uintptr_t *)((long)tsd + lVar17 + -0x10) = puVar21[1];
              *puVar21 = uVar20;
              puVar21[1] = uVar9;
              prVar16 = (rtree_leaf_elm_t *)(((uint)((ulong)aTab >> 9) & 0x1ffff8) + uVar9);
              goto LAB_00cef543;
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar17 != 0x340);
          prVar16 = duckdb_je_rtree_leaf_elm_lookup_hard
                              ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                               (uintptr_t)aTab,true,false);
          uVar19 = *puVar21;
        }
LAB_00cef543:
        pvVar6 = duckdb_je_arenas
                 [*(uint *)(((long)(prVar16->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
                  0xfff].repr;
        if (uVar19 == uVar20) {
          prVar16 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8) + puVar21[1]);
        }
        else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
                 leafkey == uVar20) {
          prVar16 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache
                    [0].leaf;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey
               = uVar19;
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
               (rtree_leaf_elm_t *)puVar21[1];
LAB_00cef82c:
          *puVar21 = uVar20;
          puVar21[1] = (uintptr_t)prVar16;
          prVar16 = (rtree_leaf_elm_t *)
                    ((long)&(prVar16->le_bits).repr + (ulong)((uint)((ulong)aTab >> 9) & 0x1ffff8));
        }
        else {
          lVar17 = 0x2d0;
          do {
            if (*(ulong *)((long)tsd + lVar17 + -8) == uVar20) {
              prVar16 = *(rtree_leaf_elm_t **)
                         (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                         + lVar17);
              puVar2 = (undefined8 *)((long)tsd + lVar17 + -0x18);
              uVar10 = puVar2[1];
              puVar3 = (undefined8 *)((long)tsd + lVar17 + -8);
              *puVar3 = *puVar2;
              puVar3[1] = uVar10;
              *(uintptr_t *)((long)tsd + lVar17 + -0x18) = uVar19;
              *(uintptr_t *)((long)tsd + lVar17 + -0x10) = puVar21[1];
              goto LAB_00cef82c;
            }
            lVar17 = lVar17 + 0x10;
          } while (lVar17 != 0x340);
          prVar16 = duckdb_je_rtree_leaf_elm_lookup_hard
                              ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                               (uintptr_t)aTab,true,false);
        }
        LOCK();
        plVar1 = (long *)((long)pvVar6 + 0x48);
        *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[(ulong)(prVar16->le_bits).repr >> 0x30];
        UNLOCK();
        arena_dalloc_no_tcache((tsdn_t *)tsd,aTab);
      }
    }
  }
LAB_00cef5a1:
  return sVar13 == 0xffffffffffffffff;
}

Assistant:

bool
ckh_remove(tsd_t *tsd, ckh_t *ckh, const void *searchkey, void **key,
    void **data) {
	size_t cell;

	assert(ckh != NULL);

	cell = ckh_isearch(ckh, searchkey);
	if (cell != SIZE_T_MAX) {
		if (key != NULL) {
			*key = (void *)ckh->tab[cell].key;
		}
		if (data != NULL) {
			*data = (void *)ckh->tab[cell].data;
		}
		ckh->tab[cell].key = NULL;
		ckh->tab[cell].data = NULL; /* Not necessary. */

		ckh->count--;
		/* Try to halve the table if it is less than 1/4 full. */
		if (ckh->count < (ZU(1) << (ckh->lg_curbuckets
		    + LG_CKH_BUCKET_CELLS - 2)) && ckh->lg_curbuckets
		    > ckh->lg_minbuckets) {
			/* Ignore error due to OOM. */
			ckh_shrink(tsd, ckh);
		}

		return false;
	}

	return true;
}